

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlObjSetWord(Ssw_Sml_t *p,Aig_Obj_t *pObj,uint Word,int iWord,int iFrame)

{
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x25e,"void Ssw_SmlObjSetWord(Ssw_Sml_t *, Aig_Obj_t *, unsigned int, int, int)")
    ;
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
    *(uint *)((long)&p[1].pAig +
             (long)iWord * 4 +
             (long)iFrame * (long)p->nWordsFrame * 4 + (long)p->nWordsTotal * (long)pObj->Id * 4) =
         Word;
    return;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                ,0x25f,"void Ssw_SmlObjSetWord(Ssw_Sml_t *, Aig_Obj_t *, unsigned int, int, int)");
}

Assistant:

void Ssw_SmlObjSetWord( Ssw_Sml_t * p, Aig_Obj_t * pObj, unsigned Word, int iWord, int iFrame )
{
    unsigned * pSims;
    assert( iFrame < p->nFrames );
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    pSims[iWord] = Word;
}